

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O3

void __thiscall test_app::test_app(test_app *this,service *srv)

{
  string *psVar1;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  cppcms::application::application(&this->super_application,srv);
  *(undefined ***)this = &PTR__test_app_0011a778;
  (this->output_)._M_dataplus._M_p = (pointer)&(this->output_).field_2;
  (this->output_)._M_string_length = 0;
  (this->output_).field_2._M_local_buf[0] = '\0';
  this->srv_ = srv;
  psVar1 = (string *)cppcms::application::mapper();
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"foo","");
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"/foo","");
  cppcms::url_mapper::assign(psVar1,(string *)local_68);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  psVar1 = (string *)cppcms::application::mapper();
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"/","");
  cppcms::url_mapper::assign(psVar1);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  psVar1 = (string *)cppcms::application::mapper();
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"/{1}","");
  cppcms::url_mapper::assign(psVar1);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  psVar1 = (string *)cppcms::application::mapper();
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"/{1}/{2}","");
  cppcms::url_mapper::assign(psVar1);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  return;
}

Assistant:

test_app(cppcms::service &srv) : 
		cppcms::application(srv),
		srv_(srv)
	{
		mapper().assign("foo","/foo");
		mapper().assign("/");
		mapper().assign("/{1}");
		mapper().assign("/{1}/{2}");
	}